

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

bool __thiscall XmlRpc::XmlRpcValue::intFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  char *in_RAX;
  long lVar1;
  char *__nptr;
  char *valueEnd;
  char *local_28;
  
  __nptr = (valueXml->_M_dataplus)._M_p + *offset;
  local_28 = in_RAX;
  lVar1 = strtol(__nptr,&local_28,10);
  if (local_28 != __nptr) {
    this->_type = TypeInt;
    (this->_value).asInt = (int)lVar1;
    *offset = *offset + ((int)local_28 - (int)__nptr);
  }
  return local_28 != __nptr;
}

Assistant:

bool XmlRpcValue::intFromXml(std::string const& valueXml, int* offset)
  {
    const char* valueStart = valueXml.c_str() + *offset;
    char* valueEnd;
    long ivalue = strtol(valueStart, &valueEnd, 10);
    if (valueEnd == valueStart)
      return false;

    _type = TypeInt;
    _value.asInt = int(ivalue);
    *offset += int(valueEnd - valueStart);
    return true;
  }